

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderMatrixTests.cpp
# Opt level: O1

void vkt::sr::anon_unknown_0::MatrixCaseUtils::Evaluator<5,_4,_4>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  float fVar1;
  int i;
  Vec4 **ppVVar2;
  undefined8 *puVar3;
  int r;
  long lVar4;
  long lVar5;
  long lVar6;
  undefined4 uVar7;
  Matrix<float,_4,_4> res;
  float afStack_100 [6];
  float local_e8 [4];
  float local_d8 [6];
  undefined8 local_c0;
  float local_b8;
  undefined8 local_b4;
  undefined4 local_ac;
  float local_a8 [4];
  float local_98 [4];
  Vec4 *pVStack_88;
  Vector<float,_3> res_3;
  undefined4 uStack_74;
  Vector<float,_3> res_1;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined4 uStack_38;
  undefined4 uStack_34;
  Type in1;
  Type in0;
  Vector<float,_3> res_2;
  
  if (in0Type == INPUTTYPE_DYNAMIC) {
    local_98[0] = (evalCtx->coords).m_data[0];
    local_98[1] = (evalCtx->coords).m_data[1];
    local_98[2] = (evalCtx->coords).m_data[2];
    local_98[3] = (evalCtx->coords).m_data[3];
  }
  else {
    local_98[0] = 1.4;
    local_98[1] = 0.2;
    local_98[2] = -0.5;
    local_98[3] = 0.7;
  }
  if (in1Type == INPUTTYPE_DYNAMIC) {
    local_a8[0] = (evalCtx->coords).m_data[0];
    local_a8[1] = (evalCtx->coords).m_data[1];
    local_a8[2] = (evalCtx->coords).m_data[2];
    local_a8[3] = (evalCtx->coords).m_data[3];
  }
  else {
    local_a8[0] = 0.2;
    local_a8[1] = -1.0;
    local_a8[2] = 0.5;
    local_a8[3] = 0.8;
  }
  ppVVar2 = &pVStack_88;
  stack0xffffffffffffff88 = 0;
  pVStack_88 = (Vec4 *)0x0;
  res_3.m_data[0] = 0.0;
  res_3.m_data[1] = 0.0;
  lVar4 = 0;
  lVar5 = 0;
  do {
    lVar6 = 0;
    do {
      uVar7 = 0x3f800000;
      if (lVar4 != lVar6) {
        uVar7 = 0;
      }
      *(undefined4 *)((long)ppVVar2 + lVar6) = uVar7;
      lVar6 = lVar6 + 0x10;
    } while (lVar6 != 0x40);
    lVar5 = lVar5 + 1;
    ppVVar2 = (Vec4 **)((long)ppVVar2 + 4);
    lVar4 = lVar4 + 0x10;
  } while (lVar5 != 4);
  ppVVar2 = &pVStack_88;
  lVar4 = 0;
  do {
    fVar1 = local_a8[lVar4];
    lVar5 = 0;
    do {
      *(float *)((long)ppVVar2 + lVar5 * 4) = *(float *)((long)local_98 + lVar5) * fVar1;
      lVar5 = lVar5 + 4;
    } while (lVar5 != 0x10);
    lVar4 = lVar4 + 1;
    ppVVar2 = (Vec4 **)((long)ppVVar2 + 4);
  } while (lVar4 != 4);
  puVar3 = &local_48;
  in1.m_data[2] = 0.0;
  in1.m_data[3] = 0.0;
  uStack_38 = 0;
  uStack_34 = 0;
  in1.m_data[0] = 0.0;
  in1.m_data[1] = 0.0;
  local_48 = 0;
  uStack_40 = 0;
  lVar4 = 0;
  lVar5 = 0;
  do {
    lVar6 = 0;
    do {
      uVar7 = 0x3f800000;
      if (lVar4 != lVar6) {
        uVar7 = 0;
      }
      *(undefined4 *)((long)puVar3 + lVar6) = uVar7;
      lVar6 = lVar6 + 0x10;
    } while (lVar6 != 0x40);
    lVar5 = lVar5 + 1;
    puVar3 = (undefined8 *)((long)puVar3 + 4);
    lVar4 = lVar4 + 0x10;
  } while (lVar5 != 4);
  puVar3 = &local_48;
  ppVVar2 = &pVStack_88;
  lVar4 = 0;
  do {
    lVar5 = 0;
    do {
      *(undefined4 *)((long)puVar3 + lVar5) = *(undefined4 *)((long)ppVVar2 + lVar5 * 4);
      lVar5 = lVar5 + 4;
    } while (lVar5 != 0x10);
    lVar4 = lVar4 + 1;
    puVar3 = puVar3 + 2;
    ppVVar2 = (Vec4 **)((long)ppVVar2 + 4);
  } while (lVar4 != 4);
  local_b4 = local_48;
  local_ac = (undefined4)uStack_40;
  local_c0 = CONCAT44(in1.m_data[0],uStack_34);
  local_b8 = in1.m_data[1];
  local_e8[0] = 0.0;
  local_e8[1] = 0.0;
  local_e8[2] = 0.0;
  lVar4 = 0;
  do {
    local_e8[lVar4] =
         *(float *)((long)&local_b4 + lVar4 * 4) + *(float *)((long)&local_c0 + lVar4 * 4);
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  local_d8[3] = 0.0;
  local_d8[4] = 0.0;
  local_d8[5] = in1.m_data[2];
  pVStack_88 = (Vec4 *)0x0;
  res_3.m_data._0_8_ = res_3.m_data._0_8_ & 0xffffffff00000000;
  lVar4 = 0;
  do {
    res_3.m_data[lVar4 + -2] = local_e8[lVar4] + local_d8[lVar4 + 3];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  local_d8[0] = 0.0;
  local_d8[1] = 0.0;
  local_d8[2] = 0.0;
  afStack_100[2] = 0.0;
  afStack_100[3] = 0.0;
  afStack_100[4] = 0.0;
  lVar4 = 0;
  do {
    afStack_100[lVar4 + 2] = res_3.m_data[lVar4 + -2] + local_d8[lVar4];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  pVStack_88 = &evalCtx->color;
  res_3.m_data[0] = 0.0;
  res_3.m_data[1] = 1.4013e-45;
  stack0xffffffffffffff88 = CONCAT44(uStack_74,2);
  lVar4 = 2;
  do {
    (evalCtx->color).m_data[(int)res_3.m_data[lVar4 + -2]] = afStack_100[lVar4];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		typename TypeTraits<In1DataType>::Type	in1	= (in1Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In1DataType>(evalCtx, 1)
																				     : getInputValue<INPUTTYPE_CONST,	In1DataType>(evalCtx, 1);
		evalCtx.color.xyz() = reduceToVec3(outerProduct(in0, in1));
	}